

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int x9_62_on_exchange(ptls_key_exchange_context_t *_ctx,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  EC_KEY *ecdh;
  int iVar1;
  int iVar2;
  EC_POINT *pub_key;
  uint8_t *out;
  size_t __size;
  
  pub_key = x9_62_decode_point((EC_GROUP *)_ctx[2].on_exchange,peerkey,(BN_CTX *)_ctx[1].on_exchange
                              );
  if (pub_key == (EC_POINT *)0x0) {
    iVar2 = 0x32;
    goto LAB_00115906;
  }
  ecdh = (EC_KEY *)_ctx[3].on_exchange;
  iVar1 = EC_GROUP_get_degree((EC_GROUP *)_ctx[2].on_exchange);
  iVar2 = iVar1 + 0xe;
  if (-1 < iVar1 + 7) {
    iVar2 = iVar1 + 7;
  }
  __size = (size_t)(iVar2 >> 3);
  out = (uint8_t *)malloc(__size);
  if (out == (uint8_t *)0x0) {
    iVar2 = 0x201;
LAB_001158ef:
    free(out);
    secret->base = (uint8_t *)0x0;
    secret->len = 0;
  }
  else {
    iVar2 = 0;
    iVar1 = ECDH_compute_key(out,__size,(EC_POINT *)pub_key,ecdh,(KDF *)0x0);
    if (iVar1 < 1) {
      iVar2 = 0x28;
      goto LAB_001158ef;
    }
    secret->base = out;
    secret->len = __size;
  }
  EC_POINT_free((EC_POINT *)pub_key);
LAB_00115906:
  x9_62_free_context((st_x9_62_keyex_context_t *)_ctx);
  return iVar2;
}

Assistant:

static int x9_62_on_exchange(ptls_key_exchange_context_t *_ctx, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x9_62_keyex_context_t *ctx = (struct st_x9_62_keyex_context_t *)_ctx;
    EC_POINT *peer_point = NULL;
    int ret;

    if ((peer_point = x9_62_decode_point(ctx->group, peerkey, ctx->bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if ((ret = ecdh_calc_secret(secret, ctx->group, ctx->privkey, peer_point)) != 0)
        goto Exit;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    x9_62_free_context(ctx);
    return ret;
}